

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::piece_picker::get_availability
          (piece_picker *this,vector<int,_piece_index_t> *avail)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  size_type s;
  pointer ppVar4;
  reference piVar5;
  __normal_iterator<libtorrent::aux::piece_picker::piece_pos_*,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
  local_30;
  iterator end;
  iterator i;
  iterator j;
  vector<int,_piece_index_t> *avail_local;
  piece_picker *this_local;
  
  s = ::std::
      vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
      ::size((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
              *)this);
  container_wrapper<int,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
  ::resize(avail,s);
  i._M_current = (piece_pos *)
                 ::std::vector<int,_std::allocator<int>_>::begin
                           (&avail->super_vector<int,_std::allocator<int>_>);
  end = ::std::
        vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
        ::begin((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                 *)this);
  local_30._M_current =
       (piece_pos *)
       ::std::
       vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
       ::end((vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
              *)this);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=(&end,&local_30);
    if (!bVar3) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<libtorrent::aux::piece_picker::piece_pos_*,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
             ::operator->(&end);
    uVar1 = *(uint *)ppVar4;
    iVar2 = this->m_seeds;
    piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
    *piVar5 = (uVar1 & 0x3ffffff) + iVar2;
    __gnu_cxx::
    __normal_iterator<libtorrent::aux::piece_picker::piece_pos_*,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
    ::operator++(&end);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&i);
  }
  return;
}

Assistant:

void piece_picker::get_availability(aux::vector<int, piece_index_t>& avail) const
	{
		TORRENT_ASSERT(m_seeds >= 0);
		INVARIANT_CHECK;

		avail.resize(m_piece_map.size());
		auto j = avail.begin();
		for (auto i = m_piece_map.begin(), end(m_piece_map.end()); i != end; ++i, ++j)
			*j = i->peer_count + m_seeds;
	}